

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

void nni_aio_finish_impl(nni_aio *aio,nng_err rv,size_t count,nni_msg *msg,_Bool sync)

{
  nni_aio_expire_q *mtx;
  
  mtx = aio->a_expire_q;
  nni_mtx_lock(&mtx->eq_mtx);
  nni_list_node_remove(&aio->a_expire_node);
  aio->a_result = rv;
  aio->a_count = count;
  aio->a_cancel_fn = (nni_aio_cancel_fn)0x0;
  aio->a_cancel_arg = (void *)0x0;
  if (msg != (nni_msg *)0x0) {
    aio->a_msg = msg;
  }
  aio->a_expire = 0xffffffffffffffff;
  aio->a_sleep = false;
  aio->a_use_expire = false;
  nni_mtx_unlock(&mtx->eq_mtx);
  if (sync) {
    nni_task_exec(&aio->a_task);
    return;
  }
  nni_task_dispatch(&aio->a_task);
  return;
}

Assistant:

static void
nni_aio_finish_impl(
    nni_aio *aio, nng_err rv, size_t count, nni_msg *msg, bool sync)
{
	nni_aio_expire_q *eq = aio->a_expire_q;

	nni_mtx_lock(&eq->eq_mtx);

	nni_aio_expire_rm(aio);
	aio->a_result     = rv;
	aio->a_count      = count;
	aio->a_cancel_fn  = NULL;
	aio->a_cancel_arg = NULL;
	if (msg) {
		aio->a_msg = msg;
	}

	aio->a_expire     = NNI_TIME_NEVER;
	aio->a_sleep      = false;
	aio->a_use_expire = false;
	nni_mtx_unlock(&eq->eq_mtx);

	if (sync) {
		nni_task_exec(&aio->a_task);
	} else {
		nni_task_dispatch(&aio->a_task);
	}
}